

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clique.cpp
# Opt level: O1

ostream * operator<<(ostream *ostream,Clique *clique)

{
  int iVar1;
  size_type pos;
  undefined4 extraout_var;
  ostream *poVar2;
  pointer puVar3;
  bool bVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ids;
  alignment_id_t local_4c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  pos = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_do_find_from
                  (clique->alignment_set,0);
  for (; pos != 0xffffffffffffffff;
      pos = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                      (clique->alignment_set,pos)) {
    iVar1 = (*clique->parent->_vptr_CliqueFinder[5])(clique->parent,pos);
    local_4c = AlignmentRecord::getID((AlignmentRecord *)CONCAT44(extraout_var,iVar1));
    if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_48,
                 (iterator)
                 local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_4c);
    }
    else {
      *local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = local_4c;
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(ostream,"[",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)ostream);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]",1);
  std::__ostream_insert<char,std::char_traits<char>>(ostream,"(",1);
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar1 = 0;
    puVar3 = local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      bVar4 = iVar1 != 0;
      iVar1 = iVar1 + -1;
      if (bVar4) {
        std::__ostream_insert<char,std::char_traits<char>>(ostream,",",1);
      }
      std::ostream::_M_insert<unsigned_long>((ulong)ostream);
      puVar3 = puVar3 + 1;
    } while (puVar3 != local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>(ostream,")",1);
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return ostream;
}

Assistant:

ostream& operator<<(ostream& ostream, const Clique& clique) {
	vector<alignment_id_t> ids;
	for (size_t i=clique.alignment_set->find_first(); i!=alignment_set_t::npos; i=clique.alignment_set->find_next(i)) {
		ids.push_back(clique.parent.getAlignmentByIndex(i).getID());
	}
	//sort(ids.begin(), ids.end());
	ostream << "[" << clique.leftmost_segment_start << ":" << clique.rightmost_segment_end << "]";
	ostream << "(";
	int n = 0;
	vector<alignment_id_t>::const_iterator it = ids.begin();
	for (; it!=ids.end(); ++it) {
		if (n++>0) ostream << ",";
		ostream << *it;
	}
	ostream << ")";
	return ostream;
}